

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefile::DeferCallScope::DeferCallScope
          (DeferCallScope *this,cmMakefile *mf,string *deferredFromFile)

{
  cmMakefile *pcVar1;
  bool bVar2;
  cmStateSnapshot local_30;
  
  this->Makefile = mf;
  cmState::CreateDeferCallSnapshot
            (&local_30,
             (mf->GlobalGenerator->CMakeInstance->State)._M_t.
             super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,&mf->StateSnapshot,
             deferredFromFile);
  pcVar1 = this->Makefile;
  (pcVar1->StateSnapshot).Position.Position = local_30.Position.Position;
  (pcVar1->StateSnapshot).State = local_30.State;
  (pcVar1->StateSnapshot).Position.Tree = local_30.Position.Tree;
  bVar2 = cmStateSnapshot::IsValid(&this->Makefile->StateSnapshot);
  if (bVar2) {
    return;
  }
  __assert_fail("this->Makefile->StateSnapshot.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmMakefile.cxx"
                ,0x2c6,
                "cmMakefile::DeferCallScope::DeferCallScope(cmMakefile *, const std::string &)");
}

Assistant:

DeferCallScope(cmMakefile* mf, std::string const& deferredFromFile)
    : Makefile(mf)
  {
    this->Makefile->StateSnapshot =
      this->Makefile->GetState()->CreateDeferCallSnapshot(
        this->Makefile->StateSnapshot, deferredFromFile);
    assert(this->Makefile->StateSnapshot.IsValid());
  }